

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

void testing::internal::TuplePrefix<3ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<unsigned_int>,testing::Matcher<unsigned_char>,testing::Matcher<std::chrono::duration<long,std::ratio<1l,1000l>>>,testing::Matcher<std::__cxx11::string_const&>>,std::tuple<unsigned_int,unsigned_char,std::chrono::duration<long,std::ratio<1l,1000l>>,std::__cxx11::string_const&>>
               (tuple<testing::Matcher<unsigned_int>,_testing::Matcher<unsigned_char>,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
                *matchers,
               tuple<unsigned_int,_unsigned_char,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *values,ostream *os)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  _Head_base<2UL,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_false> *obj_bytes;
  StringMatchResultListener listener;
  char *local_1e8;
  long local_1e0;
  char local_1d8 [16];
  undefined **local_1c8;
  undefined1 *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  TuplePrefix<2ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<unsigned_int>,testing::Matcher<unsigned_char>,testing::Matcher<std::chrono::duration<long,std::ratio<1l,1000l>>>,testing::Matcher<std::__cxx11::string_const&>>,std::tuple<unsigned_int,unsigned_char,std::chrono::duration<long,std::ratio<1l,1000l>>,std::__cxx11::string_const&>>
            (matchers,values,os);
  peVar1 = (matchers->
           super__Tuple_impl<0UL,_testing::Matcher<unsigned_int>,_testing::Matcher<unsigned_char>,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
           ).
           super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
           .
           super__Tuple_impl<2UL,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
           .
           super__Head_base<2UL,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_false>
           ._M_head_impl.super_MatcherBase<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>.
           impl_.
           super___shared_ptr<const_testing::MatcherInterface<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(matchers->
                 super__Tuple_impl<0UL,_testing::Matcher<unsigned_int>,_testing::Matcher<unsigned_char>,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
                 ).
                 super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
                 .
                 super__Tuple_impl<2UL,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
                 .
                 super__Head_base<2UL,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_false>
                 ._M_head_impl.
                 super_MatcherBase<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>.impl_ + 8))
         ->_M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  local_1c0 = local_1a8;
  local_1c8 = &PTR__StringMatchResultListener_002e1a28;
  std::__cxx11::stringstream::stringstream(local_1b8);
  obj_bytes = &(values->
               super__Tuple_impl<0UL,_unsigned_int,_unsigned_char,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               ).
               super__Tuple_impl<1UL,_unsigned_char,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               .
               super__Tuple_impl<2UL,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               .super__Head_base<2UL,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_false>;
  cVar2 = (**(code **)(*(long *)peVar1 + 0x20))(peVar1,obj_bytes,&local_1c8);
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Expected arg #",0x10);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
    peVar1 = (matchers->
             super__Tuple_impl<0UL,_testing::Matcher<unsigned_int>,_testing::Matcher<unsigned_char>,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
             ).
             super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
             .
             super__Tuple_impl<2UL,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
             .
             super__Head_base<2UL,_testing::Matcher<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>,_false>
             ._M_head_impl.super_MatcherBase<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>.
             impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (**(code **)(*(long *)peVar1 + 0x10))(peVar1,os);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n           Actual: ",0x14);
    PrintBytesInObjectTo((uchar *)obj_bytes,8,os);
    std::__cxx11::stringbuf::str();
    iVar3 = std::__cxx11::string::compare((char *)&local_1e8);
    if (iVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(os,local_1e8,local_1e0);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  }
  local_1c8 = &PTR__StringMatchResultListener_002e1a28;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename std::tuple_element<N - 1, MatcherTuple>::type matcher =
        std::get<N - 1>(matchers);
    typedef typename std::tuple_element<N - 1, ValueTuple>::type Value;
    const Value& value = std::get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      *os << "  Expected arg #" << N - 1 << ": ";
      std::get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }